

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this,string *instance)

{
  __type_conflict _Var1;
  size_type sVar2;
  const_reference __lhs;
  const_reference pvVar3;
  int local_24;
  int i;
  string *instance_local;
  EvalLog *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->runned_instances);
    if (sVar2 <= (ulong)(long)local_24) {
      return 0;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->runned_instances,(long)local_24);
    _Var1 = std::operator==(__lhs,instance);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->num_of_completed_runs,(long)local_24);
  return *pvVar3;
}

Assistant:

int EvalLog::GetNumCompletedRuns(string instance) const {
	for (int i = 0; i < runned_instances.size(); i++) {
		if (runned_instances[i] == instance)
			return num_of_completed_runs[i];
	}
	return 0;
}